

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O3

int GetCoeffsFast(VP8BitReader *br,VP8BandProbas **prob,int ctx,int *dq,int n,int16_t *out)

{
  byte bVar1;
  ulong *puVar2;
  ulong uVar3;
  VP8BandProbas *pVVar4;
  uint uVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  range_t rVar9;
  bit_t bVar10;
  int iVar11;
  int iVar12;
  VP8ProbaArray *p;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ushort local_54;
  
  if (n < 0x10) {
    p = prob[n]->probas + ctx;
    uVar8 = br->range;
    iVar12 = br->bits;
    do {
      bVar1 = (*p)[0];
      if (iVar12 < 0) {
        puVar2 = (ulong *)br->buf;
        if (puVar2 < br->buf_max) {
          uVar3 = *puVar2;
          br->buf = (uint8_t *)((long)puVar2 + 7);
          br->value = br->value << 0x38 |
                      ((uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
                       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
                       (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) >> 8;
          iVar12 = iVar12 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar12 = br->bits;
        }
      }
      uVar14 = bVar1 * uVar8 >> 8;
      bVar10 = br->value;
      uVar15 = (uint)(bVar10 >> ((byte)iVar12 & 0x3f));
      if (uVar14 < uVar15) {
        uVar8 = uVar8 - uVar14;
        bVar10 = bVar10 - ((ulong)uVar14 + 1 << ((byte)iVar12 & 0x3f));
        br->value = bVar10;
      }
      else {
        uVar8 = uVar14 + 1;
      }
      uVar5 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      iVar12 = iVar12 - (uVar5 ^ 7);
      rVar9 = (uVar8 << ((byte)(uVar5 ^ 7) & 0x1f)) - 1;
      br->bits = iVar12;
      br->range = rVar9;
      if (uVar15 <= uVar14) {
        return n;
      }
      lVar16 = (long)n;
      lVar13 = lVar16 << 0x20;
      while( true ) {
        n = n + 1;
        bVar1 = (*p)[1];
        if (iVar12 < 0) {
          puVar2 = (ulong *)br->buf;
          if (puVar2 < br->buf_max) {
            uVar3 = *puVar2;
            br->buf = (uint8_t *)((long)puVar2 + 7);
            bVar10 = bVar10 << 0x38 |
                     ((uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
                      (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
                      (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) >> 8;
            br->value = bVar10;
            iVar12 = iVar12 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
            iVar12 = br->bits;
            bVar10 = br->value;
          }
        }
        uVar15 = bVar1 * rVar9 >> 8;
        uVar8 = (uint)(bVar10 >> ((byte)iVar12 & 0x3f));
        if (uVar15 < uVar8) {
          uVar14 = rVar9 - uVar15;
          bVar10 = bVar10 - ((ulong)uVar15 + 1 << ((byte)iVar12 & 0x3f));
          br->value = bVar10;
        }
        else {
          uVar14 = uVar15 + 1;
        }
        uVar5 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        iVar12 = iVar12 - (uVar5 ^ 7);
        rVar9 = (uVar14 << ((byte)(uVar5 ^ 7) & 0x1f)) - 1;
        br->bits = iVar12;
        br->range = rVar9;
        if (uVar15 < uVar8) break;
        p = (VP8ProbaArray *)prob[lVar16 + 1];
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 0x100000000;
        if (lVar16 == 0x10) {
          return 0x10;
        }
      }
      pVVar4 = prob[n];
      bVar1 = (*p)[2];
      if (iVar12 < 0) {
        puVar2 = (ulong *)br->buf;
        if (puVar2 < br->buf_max) {
          uVar3 = *puVar2;
          br->buf = (uint8_t *)((long)puVar2 + 7);
          bVar10 = bVar10 << 0x38 |
                   ((uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
                    (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
                    (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) >> 8;
          br->value = bVar10;
          iVar12 = iVar12 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar12 = br->bits;
          bVar10 = br->value;
        }
      }
      uVar15 = bVar1 * rVar9 >> 8;
      uVar8 = (uint)(bVar10 >> ((byte)iVar12 & 0x3f));
      if (uVar15 < uVar8) {
        uVar14 = rVar9 - uVar15;
        br->value = bVar10 - ((ulong)uVar15 + 1 << ((byte)iVar12 & 0x3f));
      }
      else {
        uVar14 = uVar15 + 1;
      }
      uVar5 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      iVar7 = iVar12 - (uVar5 ^ 7);
      br->bits = iVar7;
      br->range = (uVar14 << ((byte)(uVar5 ^ 7) & 0x1f)) - 1;
      if (uVar15 < uVar8) {
        iVar12 = GetLargeValue(br,*p);
        local_54 = (ushort)iVar12;
        p = pVVar4->probas + 2;
        iVar7 = br->bits;
      }
      else {
        p = pVVar4->probas + 1;
        local_54 = 1;
      }
      if (iVar7 < 0) {
        puVar2 = (ulong *)br->buf;
        if (puVar2 < br->buf_max) {
          uVar3 = *puVar2;
          br->buf = (uint8_t *)((long)puVar2 + 7);
          br->value = br->value << 0x38 |
                      ((uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
                       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
                       (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38) >> 8;
          iVar7 = iVar7 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar7 = br->bits;
        }
      }
      uVar15 = br->range >> 1;
      iVar11 = uVar15 - (int)(br->value >> ((byte)iVar7 & 0x3f));
      uVar14 = iVar11 >> 0x1f;
      iVar12 = iVar7 + -1;
      br->bits = iVar12;
      uVar8 = br->range + uVar14 | 1;
      br->range = uVar8;
      br->value = br->value - ((ulong)(uVar15 + 1 & uVar14) << ((byte)iVar7 & 0x3f));
      uVar6 = (ushort)(iVar11 >> 0x1f);
      out[""[lVar13 >> 0x20]] = ((local_54 ^ uVar6) - uVar6) * (short)dq[0 < lVar16];
    } while (lVar16 < 0xf);
  }
  return 0x10;
}

Assistant:

static int GetCoeffsFast(VP8BitReader* const br,
                         const VP8BandProbas* const prob[],
                         int ctx, const quant_t dq, int n, int16_t* out) {
  const uint8_t* p = prob[n]->probas[ctx];
  for (; n < 16; ++n) {
    if (!VP8GetBit(br, p[0], "coeffs")) {
      return n;  // previous coeff was last non-zero coeff
    }
    while (!VP8GetBit(br, p[1], "coeffs")) {       // sequence of zero coeffs
      p = prob[++n]->probas[0];
      if (n == 16) return 16;
    }
    {        // non zero coeff
      const VP8ProbaArray* const p_ctx = &prob[n + 1]->probas[0];
      int v;
      if (!VP8GetBit(br, p[2], "coeffs")) {
        v = 1;
        p = p_ctx[1];
      } else {
        v = GetLargeValue(br, p);
        p = p_ctx[2];
      }
      out[kZigzag[n]] = VP8GetSigned(br, v, "coeffs") * dq[n > 0];
    }
  }
  return 16;
}